

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForField
          (Generator *this,FieldDescriptor *field)

{
  undefined8 uVar1;
  bool bVar2;
  FieldOptions *this_00;
  string *psVar3;
  Descriptor *pDVar4;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [8];
  string field_name;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string field_options;
  FieldDescriptor *field_local;
  Generator *this_local;
  
  field_options.field_2._8_8_ = field;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"FieldOptions",&local_59);
  this_00 = FieldDescriptor::options((FieldDescriptor *)field_options.field_2._8_8_);
  MessageLite::SerializeAsString_abi_cxx11_
            ((string *)((long)&field_name.field_2 + 8),(MessageLite *)this_00);
  OptionsValue((string *)local_38,this,&local_58,(string *)((long)&field_name.field_2 + 8));
  std::__cxx11::string::~string((string *)(field_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"None");
  if (bVar2) {
    std::__cxx11::string::string((string *)local_b0);
    bVar2 = FieldDescriptor::is_extension((FieldDescriptor *)field_options.field_2._8_8_);
    if (bVar2) {
      pDVar4 = FieldDescriptor::extension_scope((FieldDescriptor *)field_options.field_2._8_8_);
      if (pDVar4 == (Descriptor *)0x0) {
        psVar3 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)field_options.field_2._8_8_);
        std::__cxx11::string::operator=((string *)local_b0,(string *)psVar3);
      }
      else {
        pDVar4 = FieldDescriptor::extension_scope((FieldDescriptor *)field_options.field_2._8_8_);
        uVar1 = field_options.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"extensions_by_name",&local_f1);
        FieldReferencingExpression(&local_d0,this,pDVar4,(FieldDescriptor *)uVar1,&local_f0);
        std::__cxx11::string::operator=((string *)local_b0,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator(&local_f1);
      }
    }
    else {
      pDVar4 = FieldDescriptor::containing_type((FieldDescriptor *)field_options.field_2._8_8_);
      uVar1 = field_options.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"fields_by_name",&local_139);
      FieldReferencingExpression(&local_118,this,pDVar4,(FieldDescriptor *)uVar1,&local_138);
      std::__cxx11::string::operator=((string *)local_b0,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
    }
    anon_unknown_0::PrintDescriptorOptionsFixingCode
              ((string *)local_b0,(string *)local_38,this->printer_);
    std::__cxx11::string::~string((string *)local_b0);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Generator::FixOptionsForField(
    const FieldDescriptor& field) const {
  string field_options = OptionsValue(
      "FieldOptions", field.options().SerializeAsString());
  if (field_options != "None") {
    string field_name;
    if (field.is_extension()) {
      if (field.extension_scope() == NULL) {
        // Top level extensions.
        field_name = field.name();
      } else {
        field_name = FieldReferencingExpression(
            field.extension_scope(), field, "extensions_by_name");
      }
    } else {
      field_name = FieldReferencingExpression(
          field.containing_type(), field, "fields_by_name");
    }
    PrintDescriptorOptionsFixingCode(field_name, field_options, printer_);
  }
}